

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O0

bool google::protobuf::internal::
     AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>>
               (RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *t)

{
  bool bVar1;
  int index;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  
  index = RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::size
                    ((RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *)0x539e63);
  do {
    index = index + -1;
    if (index < 0) {
      return true;
    }
    RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::Get(in_RDI,index);
    bVar1 = EnumValueDescriptorProto::IsInitialized
                      ((EnumValueDescriptorProto *)CONCAT44(index,in_stack_ffffffffffffffe8));
  } while (bVar1);
  return false;
}

Assistant:

bool AllAreInitialized(const Type& t) {
  for (int i = t.size(); --i >= 0;) {
    if (!t.Get(i).IsInitialized()) return false;
  }
  return true;
}